

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

Path * __thiscall
tinyusdz::Path::append_element(Path *__return_storage_ptr__,Path *this,string *elem)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  undefined1 *puVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  variant;
  undefined8 auStack_80 [2];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  local_70;
  
  if (elem->_M_string_length != 0) {
    auStack_80[0] = 0x125470;
    bVar3 = is_variantElementName(elem);
    if (bVar3) {
      lVar4 = 0x10;
      do {
        puVar5 = (undefined1 *)((long)&local_70._M_elems[0]._M_dataplus._M_p + lVar4);
        *(undefined1 **)((long)auStack_80 + lVar4) = puVar5;
        *(undefined8 *)((long)auStack_80 + lVar4 + 8) = 0;
        *puVar5 = 0;
        lVar4 = lVar4 + 0x20;
      } while (lVar4 != 0x50);
      auStack_80[0] = 0x1254ab;
      bVar3 = tokenize_variantElement(elem,&local_70);
      if (bVar3) {
        auStack_80[0] = 0x1254c2;
        std::__cxx11::string::_M_assign((string *)&this->_variant_part);
        auStack_80[0] = 0x1254ce;
        std::__cxx11::string::_M_assign((string *)&this->_variant_selection_part);
        auStack_80[0] = 0x1254dd;
        std::__cxx11::string::_M_append((char *)this,(ulong)(elem->_M_dataplus)._M_p);
        auStack_80[0] = 0x1254ec;
        std::__cxx11::string::_M_assign((string *)&this->_element);
        auStack_80[0] = 0x1254f7;
        Path(__return_storage_ptr__,this);
      }
      else {
        this->_valid = false;
      }
      lVar4 = -0x40;
      paVar6 = &local_70._M_elems[1].field_2;
      do {
        if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar6->_M_allocated_capacity)[-2]) {
          auStack_80[0] = 0x125522;
          operator_delete((long *)(&paVar6->_M_allocated_capacity)[-2],
                          paVar6->_M_allocated_capacity + 1);
        }
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar6->_M_allocated_capacity + -4);
        lVar4 = lVar4 + 0x20;
      } while (lVar4 != 0);
      if (bVar3) {
        return __return_storage_ptr__;
      }
    }
    pcVar2 = (elem->_M_dataplus)._M_p;
    cVar1 = *pcVar2;
    if ((cVar1 != '.') && (cVar1 != '[')) {
      if (((this->_prim_part)._M_string_length == 1) &&
         (*(this->_prim_part)._M_dataplus._M_p == '/')) {
        auStack_80[0] = 0x125581;
        std::__cxx11::string::_M_append((char *)this,(ulong)pcVar2);
      }
      else {
        auStack_80[0] = 0x125598;
        std::operator+(local_70._M_elems,'/',elem);
        auStack_80[0] = 0x1255a9;
        std::__cxx11::string::_M_append((char *)this,(ulong)local_70._M_elems[0]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_elems[0]._M_dataplus._M_p != &local_70._M_elems[0].field_2) {
          auStack_80[0] = 0x1255c4;
          operator_delete(local_70._M_elems[0]._M_dataplus._M_p,
                          local_70._M_elems[0].field_2._M_allocated_capacity + 1);
        }
      }
      auStack_80[0] = 0x1255d3;
      std::__cxx11::string::_M_assign((string *)&this->_element);
      goto LAB_00125549;
    }
  }
  this->_valid = false;
LAB_00125549:
  auStack_80[0] = 0x125554;
  Path(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Path Path::append_element(const std::string &elem) {
  Path &p = (*this);

  if (elem.empty()) {
    p._valid = false;
    return p;
  }

  // {variant=value}
  if (is_variantElementName(elem)) {
    std::array<std::string, 2> variant;
    if (tokenize_variantElement(elem, &variant)) {
      _variant_part = variant[0];
      _variant_selection_part = variant[0];
      _prim_part += elem;
      _element = elem;
      return p;
    } else {
      p._valid = false;
    }
  }

  if (elem[0] == '[') {
    // relational attrib are not supported
    p._valid = false;
    return p;
  } else if (elem[0] == '.') {
    // Relative path
    // For a while, make this valid.
    p._valid = false;
    return p;
  } else {
    // std::cout << "elem " << elem << "\n";
    if ((p._prim_part.size() == 1) && (p._prim_part[0] == '/')) {
      p._prim_part += elem;
    } else {
      // TODO: Validate element name.
      p._prim_part += '/' + elem;
    }

    // Also store raw element name
    p._element = elem;

    return p;
  }
}